

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_color_hsva_bv(nk_byte *out,nk_color in)

{
  undefined4 in_ESI;
  int *in_RDI;
  int tmp [4];
  undefined1 local_28;
  undefined1 local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  
  nk_color_hsva_i((int *)CONCAT44(in_ESI,in_stack_fffffffffffffff8),in_RDI,in_stack_ffffffffffffffe8
                  ,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (nk_color)tmp[1]);
  *(undefined1 *)in_RDI = local_28;
  *(undefined1 *)((long)in_RDI + 1) = local_24;
  *(char *)((long)in_RDI + 2) = (char)in_stack_ffffffffffffffe0;
  *(char *)((long)in_RDI + 3) = (char)in_stack_ffffffffffffffe4;
  return;
}

Assistant:

NK_API void
nk_color_hsva_bv(nk_byte *out, struct nk_color in)
{
int tmp[4];
nk_color_hsva_i(&tmp[0], &tmp[1], &tmp[2], &tmp[3], in);
out[0] = (nk_byte)tmp[0];
out[1] = (nk_byte)tmp[1];
out[2] = (nk_byte)tmp[2];
out[3] = (nk_byte)tmp[3];
}